

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetUint64Id(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_uint64_ty;
  Integer uint64_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->uint64_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    uint64_ty._40_8_ = IRContext::get_type_mgr(this_00);
    analysis::Integer::Integer((Integer *)&reg_uint64_ty,0x40,false);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)uint64_ty._40_8_,(Type *)&reg_uint64_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction((TypeManager *)uint64_ty._40_8_,type);
    this->uint64_id_ = uVar1;
    analysis::Integer::~Integer((Integer *)&reg_uint64_ty);
  }
  return this->uint64_id_;
}

Assistant:

uint32_t InstrumentPass::GetUint64Id() {
  if (uint64_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Integer uint64_ty(64, false);
    analysis::Type* reg_uint64_ty = type_mgr->GetRegisteredType(&uint64_ty);
    uint64_id_ = type_mgr->GetTypeInstruction(reg_uint64_ty);
  }
  return uint64_id_;
}